

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

void ngram_search_save_bp(ngram_search_t *ngs,int frame_idx,int32 w,int32 score,int32 path,int32 rc)

{
  int bp_00;
  bptbl_t *pbVar1;
  int32 *piVar2;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  bptbl_t *be;
  int32 rcsize;
  int32 i;
  int32 newlh [2];
  int32 bplh [2];
  int32 bp;
  int32 rc_local;
  int32 path_local;
  int32 score_local;
  int32 w_local;
  int frame_idx_local;
  ngram_search_t *ngs_local;
  
  bp_00 = ngs->word_lat_idx[w];
  if (bp_00 == -1) {
    if (ngs->bpidx == -1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x1bc,"No entries in backpointer table!");
    }
    else {
      if (ngs->bp_table_size <= ngs->bpidx) {
        ngs->bp_table_size = ngs->bp_table_size << 1;
        pbVar1 = (bptbl_t *)
                 __ckd_realloc__(ngs->bp_table,(long)ngs->bp_table_size * 0x24,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                 ,0x1c5);
        ngs->bp_table = pbVar1;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x1c6,"Resized backpointer table to %d entries\n",(ulong)(uint)ngs->bp_table_size);
      }
      if (ngs->bscore_stack_size - ((ngs->base).acmod)->mdef->n_ciphone <= ngs->bss_head) {
        ngs->bscore_stack_size = ngs->bscore_stack_size << 1;
        piVar2 = (int32 *)__ckd_realloc__(ngs->bscore_stack,(long)ngs->bscore_stack_size << 2,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                          ,0x1cd);
        ngs->bscore_stack = piVar2;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x1ce,"Resized score stack to %d entries\n",(ulong)(uint)ngs->bscore_stack_size);
      }
      ngs->word_lat_idx[w] = ngs->bpidx;
      pbVar1 = ngs->bp_table + ngs->bpidx;
      pbVar1->wid = w;
      pbVar1->frame = frame_idx;
      pbVar1->bp = path;
      pbVar1->score = score;
      pbVar1->s_idx = ngs->bss_head;
      pbVar1->valid = '\x01';
      if (path == ngs->bpidx) {
        __assert_fail("path != ngs->bpidx",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x1d9,
                      "void ngram_search_save_bp(ngram_search_t *, int, int32, int32, int32, int32)"
                     );
      }
      pbVar1->last_phone =
           ((ngs->base).dict)->word[w].ciphone[((ngs->base).dict)->word[w].pronlen + -1];
      if (((ngs->base).dict)->word[w].pronlen == 1) {
        pbVar1->last2_phone = -1;
        pbVar1->s_idx = -1;
        be._0_4_ = 0;
      }
      else {
        pbVar1->last2_phone =
             ((ngs->base).dict)->word[w].ciphone[((ngs->base).dict)->word[w].pronlen + -2];
        be._0_4_ = ((ngs->base).d2p)->rssid[pbVar1->last_phone][pbVar1->last2_phone].n_ssid;
      }
      for (be._4_4_ = 0; be._4_4_ < (int32)be; be._4_4_ = be._4_4_ + 1) {
        ngs->bscore_stack[ngs->bss_head + be._4_4_] = -0x20000000;
      }
      if ((int32)be != 0) {
        ngs->bscore_stack[ngs->bss_head + rc] = score;
      }
      set_real_wid(ngs,ngs->bpidx);
      ngs->bpidx = ngs->bpidx + 1;
      ngs->bss_head = (int32)be + ngs->bss_head;
    }
  }
  else {
    if (2000 < frame_idx - ngs->bp_table[path].frame) {
      if (w < 0) {
        local_50 = (char *)0x0;
      }
      else {
        local_50 = ((ngs->base).dict)->word[w].word;
      }
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x187,"Word \'%s\' survived for %d frames, potential overpruning\n",local_50,
              (ulong)(uint)(frame_idx - ngs->bp_table[path].frame));
    }
    if (ngs->bp_table[bp_00].score < score) {
      if (path == bp_00) {
        __assert_fail("path != bp",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x18e,
                      "void ngram_search_save_bp(ngram_search_t *, int, int32, int32, int32, int32)"
                     );
      }
      if (ngs->bp_table[bp_00].bp != path) {
        if (ngs->bp_table[bp_00].bp == -1) {
          local_54 = -1;
        }
        else {
          local_54 = ngs->bp_table[ngs->bp_table[bp_00].bp].prev_real_wid;
        }
        if (ngs->bp_table[bp_00].bp == -1) {
          local_58 = -1;
        }
        else {
          local_58 = ngs->bp_table[ngs->bp_table[bp_00].bp].real_wid;
        }
        if (path == -1) {
          local_5c = -1;
          local_60 = -1;
        }
        else {
          local_5c = ngs->bp_table[path].prev_real_wid;
          local_60 = ngs->bp_table[path].real_wid;
        }
        if ((local_54 != local_5c) || (local_58 != local_60)) {
          set_real_wid(ngs,bp_00);
        }
        ngs->bp_table[bp_00].bp = path;
      }
      ngs->bp_table[bp_00].score = score;
    }
    if (ngs->bp_table[bp_00].s_idx != -1) {
      ngs->bscore_stack[ngs->bp_table[bp_00].s_idx + rc] = score;
    }
  }
  return;
}

Assistant:

void
ngram_search_save_bp(ngram_search_t *ngs, int frame_idx,
                     int32 w, int32 score, int32 path, int32 rc)
{
    int32 bp;

    /* Look for an existing exit for this word in this frame.  The
     * only reason one would exist is from a different right context
     * triphone, but of course that happens quite frequently. */
    bp = ngs->word_lat_idx[w];
    if (bp != NO_BP) {

        if (frame_idx - ngs->bp_table[path].frame > NGRAM_HISTORY_LONG_WORD) {
    	    E_WARN("Word '%s' survived for %d frames, potential overpruning\n", dict_wordstr(ps_search_dict(ngs), w),
	    	    frame_idx - ngs->bp_table[path].frame);
	}

        /* Keep only the best scoring one, we will reconstruct the
         * others from the right context scores - usually the history
         * is not lost. */
        if (ngs->bp_table[bp].score WORSE_THAN score) {
            assert(path != bp); /* Pathological. */
            if (ngs->bp_table[bp].bp != path) {
                int32 bplh[2], newlh[2];
                /* But, sometimes, the history *is* lost.  If we wanted to
                 * do exact language model scoring we'd have to preserve
                 * these alternate histories. */
                E_DEBUG("Updating path history %d => %d frame %d\n",
                        ngs->bp_table[bp].bp, path, frame_idx);
                bplh[0] = ngs->bp_table[bp].bp == -1
                    ? -1 : ngs->bp_table[ngs->bp_table[bp].bp].prev_real_wid;
                bplh[1] = ngs->bp_table[bp].bp == -1
                    ? -1 : ngs->bp_table[ngs->bp_table[bp].bp].real_wid;
                newlh[0] = path == -1
                    ? -1 : ngs->bp_table[path].prev_real_wid;
                newlh[1] = path == -1
                    ? -1 : ngs->bp_table[path].real_wid;
                /* Actually it's worth checking how often the actual
                 * language model state changes. */
                if (bplh[0] != newlh[0] || bplh[1] != newlh[1]) {
                    /* It's fairly rare that the actual language model
                     * state changes, but it does happen some
                     * times. */
                    E_DEBUG("Updating language model state %s,%s => %s,%s frame %d\n",
                                dict_wordstr(ps_search_dict(ngs), bplh[0]),
                                dict_wordstr(ps_search_dict(ngs), bplh[1]),
                                dict_wordstr(ps_search_dict(ngs), newlh[0]),
                                dict_wordstr(ps_search_dict(ngs), newlh[1]),
                                frame_idx);
                    set_real_wid(ngs, bp);
                }
                ngs->bp_table[bp].bp = path;
            }
            ngs->bp_table[bp].score = score;
        }
        /* But do keep track of scores for all right contexts, since
         * we need them to determine the starting path scores for any
         * successors of this word exit. */
        if (ngs->bp_table[bp].s_idx != -1)
            ngs->bscore_stack[ngs->bp_table[bp].s_idx + rc] = score;
    }
    else {
        int32 i, rcsize;
        bptbl_t *be;

        /* This might happen if recognition fails. */
        if (ngs->bpidx == NO_BP) {
            E_ERROR("No entries in backpointer table!");
            return;
        }

        /* Expand the backpointer tables if necessary. */
        if (ngs->bpidx >= ngs->bp_table_size) {
            ngs->bp_table_size *= 2;
            ngs->bp_table = ckd_realloc(ngs->bp_table,
                                        ngs->bp_table_size
                                        * sizeof(*ngs->bp_table));
            E_INFO("Resized backpointer table to %d entries\n", ngs->bp_table_size);
        }
        if (ngs->bss_head >= ngs->bscore_stack_size
            - bin_mdef_n_ciphone(ps_search_acmod(ngs)->mdef)) {
            ngs->bscore_stack_size *= 2;
            ngs->bscore_stack = ckd_realloc(ngs->bscore_stack,
                                            ngs->bscore_stack_size
                                            * sizeof(*ngs->bscore_stack));
            E_INFO("Resized score stack to %d entries\n", ngs->bscore_stack_size);
        }

        ngs->word_lat_idx[w] = ngs->bpidx;
        be = &(ngs->bp_table[ngs->bpidx]);
        be->wid = w;
        be->frame = frame_idx;
        be->bp = path;
        be->score = score;
        be->s_idx = ngs->bss_head;
        be->valid = TRUE;
        assert(path != ngs->bpidx);

        /* DICT2PID */
        /* Get diphone ID for final phone and number of ssids corresponding to it. */
        be->last_phone = dict_last_phone(ps_search_dict(ngs),w);
        if (dict_is_single_phone(ps_search_dict(ngs), w)) {
            be->last2_phone = -1;
            be->s_idx = -1;
            rcsize = 0;
        }
        else {
            be->last2_phone = dict_second_last_phone(ps_search_dict(ngs),w);
            rcsize = dict2pid_rssid(ps_search_dict2pid(ngs),
                                    be->last_phone, be->last2_phone)->n_ssid;
        }
        /* Allocate some space on the bscore_stack for all of these triphones. */
        for (i = 0; i < rcsize; ++i)
            ngs->bscore_stack[ngs->bss_head + i] = WORST_SCORE;
        if (rcsize)
            ngs->bscore_stack[ngs->bss_head + rc] = score;
        set_real_wid(ngs, ngs->bpidx);

        ngs->bpidx++;
        ngs->bss_head += rcsize;
    }
}